

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

StringPtr __thiscall capnp::Schema::getUnqualifiedName(Schema *this)

{
  uint32_t uVar1;
  ArrayPtr<const_char> AVar2;
  ArrayPtr<const_char> local_60;
  undefined1 local_50 [8];
  Reader proto;
  Schema *this_local;
  
  proto._reader._40_8_ = this;
  getProto((Reader *)local_50,this);
  local_60 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)local_50);
  uVar1 = capnp::schema::Node::Reader::getDisplayNamePrefixLength((Reader *)local_50);
  AVar2 = (ArrayPtr<const_char>)kj::StringPtr::slice((StringPtr *)&local_60,(ulong)uVar1);
  return (StringPtr)AVar2;
}

Assistant:

const kj::StringPtr Schema::getUnqualifiedName() const {
  auto proto = getProto();
  return proto.getDisplayName().slice(proto.getDisplayNamePrefixLength());
}